

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O2

bool __thiscall gui::MenuBar::handleMouseMove(MenuBar *this,Vector2f *mouseParent)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Vector2f mouseLocal;
  Vector2f local_18;
  
  bVar1 = Widget::handleMouseMove(&this->super_Widget,mouseParent);
  bVar2 = true;
  if (!bVar1) {
    iVar3 = (*(this->super_Widget).super_Drawable._vptr_Drawable[6])(this,mouseParent);
    if ((char)iVar3 != '\0') {
      local_18 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
      mouseUpdate(this,false,false,&local_18);
      bVar1 = Widget::isFocused(&this->super_Widget);
      return bVar1;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MenuBar::handleMouseMove(const sf::Vector2f& mouseParent) {
    if (baseClass::handleMouseMove(mouseParent)) {
        return true;
    } else if (!isMouseIntersecting(mouseParent)) {
        return false;
    }
    const auto mouseLocal = toLocalOriginSpace(mouseParent);

    mouseUpdate(false, false, mouseLocal);
    return isFocused();
}